

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x839c70;
  *(undefined8 *)&this->field_0x30 = 0x839d88;
  *(undefined8 *)&this[-1].field_0xd0 = 0x839c98;
  *(undefined8 *)&this[-1].field_0xe0 = 0x839cc0;
  *(undefined8 *)&this[-1].field_0x118 = 0x839ce8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x839d10;
  *(undefined8 *)&this[-1].field_0x180 = 0x839d38;
  *(undefined8 *)this = 0x839d60;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__00839da8);
  operator_delete(&this[-1].field_0x48,400);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}